

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

void wprefs(settings_w *sesskey,char *name,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *s_1;
  char *s;
  int maxlen;
  int i;
  char *p;
  char *buf;
  int primary_local;
  Conf *conf_local;
  int nvals_local;
  keyvalwhere *mapping_local;
  char *name_local;
  settings_w *sesskey_local;
  
  s._0_4_ = 0;
  for (s._4_4_ = 0; s._4_4_ < nvals; s._4_4_ = s._4_4_ + 1) {
    iVar2 = conf_get_int_int(conf,primary,s._4_4_);
    pcVar3 = val2key(mapping,nvals,iVar2);
    if (pcVar3 != (char *)0x0) {
      sVar4 = strlen(pcVar3);
      s._0_4_ = (int)s + (uint)(0 < (int)s) + (int)sVar4;
    }
  }
  pcVar3 = (char *)safemalloc((long)((int)s + 1),1,0);
  _maxlen = pcVar3;
  for (s._4_4_ = 0; s._4_4_ < nvals; s._4_4_ = s._4_4_ + 1) {
    iVar2 = conf_get_int_int(conf,primary,s._4_4_);
    pcVar5 = val2key(mapping,nvals,iVar2);
    if (pcVar5 != (char *)0x0) {
      pcVar1 = " \t";
      if (pcVar3 < _maxlen) {
        pcVar1 = "%s,";
      }
      iVar2 = sprintf(_maxlen,"%s%s",pcVar1 + 2,pcVar5);
      _maxlen = _maxlen + iVar2;
    }
  }
  if ((long)_maxlen - (long)pcVar3 == (long)(int)s) {
    *_maxlen = '\0';
    write_setting_s(sesskey,name,pcVar3);
    safefree(pcVar3);
    return;
  }
  __assert_fail("p - buf == maxlen",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c",0x1d5
                ,
                "void wprefs(settings_w *, const char *, const struct keyvalwhere *, int, Conf *, int)"
               );
}

Assistant:

static void wprefs(settings_w *sesskey, const char *name,
                   const struct keyvalwhere *mapping, int nvals,
                   Conf *conf, int primary)
{
    char *buf, *p;
    int i, maxlen;

    for (maxlen = i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            maxlen += (maxlen > 0 ? 1 : 0) + strlen(s);
        }
    }

    buf = snewn(maxlen + 1, char);
    p = buf;

    for (i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            p += sprintf(p, "%s%s", (p > buf ? "," : ""), s);
        }
    }

    assert(p - buf == maxlen);
    *p = '\0';

    write_setting_s(sesskey, name, buf);

    sfree(buf);
}